

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

void __thiscall aiMetadata::aiMetadata(aiMetadata *this,aiMetadata *rhs)

{
  aiMetadataType aVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  aiString *paVar6;
  ulong uVar7;
  aiMetadataEntry *paVar8;
  void *pvVar9;
  undefined4 *puVar10;
  char *pcVar11;
  undefined8 *puVar12;
  aiString *local_488;
  undefined1 local_468 [8];
  aiVector3D v_5;
  undefined1 local_44c [8];
  aiString v_4;
  double v_3;
  float v_2;
  uint64_t v_1;
  ulong uStack_28;
  int32_t v;
  size_t i_1;
  size_t i;
  aiMetadata *rhs_local;
  aiMetadata *this_local;
  
  this->mNumProperties = rhs->mNumProperties;
  this->mKeys = (aiString *)0x0;
  this->mValues = (aiMetadataEntry *)0x0;
  uVar7 = CONCAT44(0,this->mNumProperties);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar5 = SUB168(auVar4 * ZEXT816(0x404),0);
  if (SUB168(auVar4 * ZEXT816(0x404),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  paVar6 = (aiString *)operator_new__(uVar5);
  if (uVar7 != 0) {
    local_488 = paVar6;
    do {
      aiString::aiString(local_488);
      local_488 = local_488 + 1;
    } while (local_488 != paVar6 + uVar7);
  }
  this->mKeys = paVar6;
  for (i_1 = 0; i_1 < this->mNumProperties; i_1 = i_1 + 1) {
    aiString::operator=(this->mKeys + i_1,rhs->mKeys + i_1);
  }
  auVar4 = ZEXT416(this->mNumProperties) * ZEXT816(0x10);
  uVar7 = auVar4._0_8_;
  if (auVar4._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  paVar8 = (aiMetadataEntry *)operator_new__(uVar7);
  this->mValues = paVar8;
  for (uStack_28 = 0; uStack_28 < this->mNumProperties; uStack_28 = uStack_28 + 1) {
    this->mValues[uStack_28].mType = rhs->mValues[uStack_28].mType;
    aVar1 = rhs->mValues[uStack_28].mType;
    if (aVar1 == AI_BOOL) {
      pvVar9 = operator_new(1);
      this->mValues[uStack_28].mData = pvVar9;
      *(undefined1 *)this->mValues[uStack_28].mData = *rhs->mValues[uStack_28].mData;
    }
    else if (aVar1 == AI_INT32) {
      uVar2 = *rhs->mValues[uStack_28].mData;
      puVar10 = (undefined4 *)operator_new(4);
      *puVar10 = uVar2;
      this->mValues[uStack_28].mData = puVar10;
    }
    else if (aVar1 == AI_UINT64) {
      uVar3 = *rhs->mValues[uStack_28].mData;
      puVar12 = (undefined8 *)operator_new(8);
      *puVar12 = uVar3;
      this->mValues[uStack_28].mData = puVar12;
    }
    else if (aVar1 == AI_FLOAT) {
      uVar2 = *rhs->mValues[uStack_28].mData;
      puVar10 = (undefined4 *)operator_new(4);
      *puVar10 = uVar2;
      this->mValues[uStack_28].mData = puVar10;
    }
    else if (aVar1 == AI_DOUBLE) {
      v_4.data._1016_8_ = *rhs->mValues[uStack_28].mData;
      pcVar11 = (char *)operator_new(8);
      *(undefined8 *)pcVar11 = v_4.data._1016_8_;
      this->mValues[uStack_28].mData = pcVar11;
    }
    else if (aVar1 == AI_AISTRING) {
      aiString::aiString((aiString *)local_44c);
      Get<aiString>(rhs,this->mKeys + uStack_28,(aiString *)local_44c);
      paVar6 = (aiString *)operator_new(0x404);
      aiString::aiString(paVar6,(aiString *)local_44c);
      this->mValues[uStack_28].mData = paVar6;
    }
    else if (aVar1 == AI_AIVECTOR3D) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_468);
      Get<aiVector3t<float>>(rhs,this->mKeys + uStack_28,(aiVector3t<float> *)local_468);
      puVar12 = (undefined8 *)operator_new(0xc);
      *puVar12 = local_468;
      *(float *)(puVar12 + 1) = v_5.x;
      this->mValues[uStack_28].mData = puVar12;
    }
  }
  return;
}

Assistant:

aiMetadata( const aiMetadata &rhs )
    : mNumProperties( rhs.mNumProperties )
    , mKeys( nullptr )
    , mValues( nullptr ) {
        mKeys = new aiString[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>( mNumProperties ); ++i ) {
            mKeys[ i ] = rhs.mKeys[ i ];
        }
        mValues = new aiMetadataEntry[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>(mNumProperties); ++i ) {
            mValues[ i ].mType = rhs.mValues[ i ].mType;
            switch ( rhs.mValues[ i ].mType ) {
            case AI_BOOL:
                mValues[ i ].mData = new bool;
                ::memcpy( mValues[ i ].mData, rhs.mValues[ i ].mData, sizeof(bool) );
                break;
            case AI_INT32: {
                int32_t v;
                ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( int32_t ) );
                mValues[ i ].mData = new int32_t( v );
                }
                break;
            case AI_UINT64: {
                    uint64_t v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( uint64_t ) );
                    mValues[ i ].mData = new  uint64_t( v );
                }
                break;
            case AI_FLOAT: {
                    float v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( float ) );
                    mValues[ i ].mData = new float( v );
                }
                break;
            case AI_DOUBLE: {
                    double v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( double ) );
                    mValues[ i ].mData = new double( v );
                }
                break;
            case AI_AISTRING: {
                    aiString v;
                    rhs.Get<aiString>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiString( v );
                }
                break;
            case AI_AIVECTOR3D: {
                    aiVector3D v;
                    rhs.Get<aiVector3D>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiVector3D( v );
                }
                break;
#ifndef SWIG
            case FORCE_32BIT:
#endif
            default:
                break;
            }

        }
    }